

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editordetector.cpp
# Opt level: O0

QString * findInPath(QString *__return_storage_ptr__,QString *fileName)

{
  bool bVar1;
  byte bVar2;
  const_iterator o;
  QFileInfo local_c8 [8];
  QFileInfo fileInfo;
  undefined1 local_b8 [8];
  QString path_;
  QString *path_1;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList *__range1;
  undefined1 local_70 [8];
  QStringList paths;
  QLatin1Char separator;
  QByteArray local_48;
  undefined1 local_30 [8];
  QString path;
  QString *fileName_local;
  
  path.d.size = (qsizetype)fileName;
  qgetenv((char *)&local_48);
  QString::fromLocal8Bit<void>((QString *)local_30,&local_48);
  QByteArray::~QByteArray(&local_48);
  QLatin1Char::QLatin1Char((QLatin1Char *)((long)&paths.d.size + 3),':');
  __range1._5_1_ = paths.d.size._3_1_;
  QChar::QChar((QChar *)((long)&__range1 + 6),paths.d.size._3_1_);
  QFlags<Qt::SplitBehaviorFlags>::QFlags((QFlags<Qt::SplitBehaviorFlags> *)&__range1,KeepEmptyParts)
  ;
  QString::split((QChar *)local_70,(QFlags_conflict1 *)local_30,(uint)__range1._6_2_);
  __end1 = QList<QString>::begin((QList<QString> *)local_70);
  o = QList<QString>::end((QList<QString> *)local_70);
  while (bVar1 = QList<QString>::const_iterator::operator!=(&__end1,o), bVar1) {
    path_.d.size = (qsizetype)QList<QString>::const_iterator::operator*(&__end1);
    QDir::QDir((QDir *)&fileInfo,(QString *)path_.d.size);
    QDir::filePath((QString *)local_b8);
    QDir::~QDir((QDir *)&fileInfo);
    QFileInfo::QFileInfo(local_c8,(QString *)local_b8);
    bVar2 = QFileInfo::exists();
    if ((((bVar2 & 1) == 0) || (bVar2 = QFileInfo::isFile(), (bVar2 & 1) == 0)) ||
       (bVar2 = QFileInfo::isExecutable(), (bVar2 & 1) == 0)) {
      bVar1 = false;
    }
    else {
      QDir::toNativeSeparators(__return_storage_ptr__);
      bVar1 = true;
    }
    QFileInfo::~QFileInfo(local_c8);
    QString::~QString((QString *)local_b8);
    if (bVar1) goto LAB_0013fea9;
    QList<QString>::const_iterator::operator++(&__end1);
  }
  QString::QString(__return_storage_ptr__);
LAB_0013fea9:
  QList<QString>::~QList((QList<QString> *)local_70);
  QString::~QString((QString *)local_30);
  return __return_storage_ptr__;
}

Assistant:

QString findInPath(const QString &fileName)
{
    const QString path = QString::fromLocal8Bit(qgetenv("PATH"));
#if defined(Q_OS_WIN32)
    QLatin1Char separator(';');
#else
    QLatin1Char separator(':');
#endif

    const QStringList paths = path.split(separator);
    for (const QString &path : paths) {
        QString path_ = QDir(path).filePath(fileName);
        QFileInfo fileInfo(path_);
        if (fileInfo.exists() && fileInfo.isFile() && fileInfo.isExecutable())
            return QDir::toNativeSeparators(path_);
    }

    return QString();
}